

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O1

void Fra_ParamsDefaultSeq(Fra_Par_t *pPars)

{
  *(undefined8 *)pPars = 0;
  pPars->dSimSatur = 0.0;
  pPars->fPatScores = 0;
  pPars->MaxScore = 0;
  pPars->dActConeRatio = 0.0;
  pPars->fProve = 0;
  pPars->fVerbose = 0;
  pPars->fDoSparse = 0;
  pPars->fConeBias = 0;
  pPars->dActConeBumpMax = 0.0;
  pPars->fChoicing = 0;
  pPars->fSpeculate = 0;
  pPars->nBTLimitNode = 0;
  pPars->nBTLimitMiter = 0;
  pPars->nLevelMax = 0;
  pPars->nFramesP = 0;
  pPars->nFramesK = 0;
  pPars->nMaxImps = 0;
  pPars->nMaxLevs = 0;
  pPars->fRewrite = 0;
  pPars->fLatchCorr = 0;
  pPars->fUseImps = 0;
  pPars->fUse1Hot = 0;
  pPars->fWriteImps = 0;
  *(undefined8 *)&pPars->fDontShowBar = 0;
  pPars->nSimWords = 1;
  pPars->dSimSatur = 0.005;
  pPars->fPatScores = 0;
  pPars->MaxScore = 0x19;
  pPars->fDoSparse = 1;
  pPars->fConeBias = 0;
  pPars->dActConeRatio = 0.3;
  pPars->dActConeBumpMax = 10.0;
  pPars->nBTLimitNode = 10000000;
  pPars->nBTLimitMiter = 500000;
  pPars->nFramesK = 1;
  pPars->fRewrite = 0;
  pPars->fLatchCorr = 0;
  return;
}

Assistant:

void Fra_ParamsDefaultSeq( Fra_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Fra_Par_t) );
    pPars->nSimWords        =        1;  // the number of words in the simulation info
    pPars->dSimSatur        =    0.005;  // the ratio of refined classes when saturation is reached
    pPars->fPatScores       =        0;  // enables simulation pattern scoring
    pPars->MaxScore         =       25;  // max score after which resimulation is used
    pPars->fDoSparse        =        1;  // skips sparse functions
    pPars->dActConeRatio    =      0.3;  // the ratio of cone to be bumped
    pPars->dActConeBumpMax  =     10.0;  // the largest bump of activity
    pPars->nBTLimitNode     = 10000000;  // conflict limit at a node
    pPars->nBTLimitMiter    =   500000;  // conflict limit at an output
    pPars->nFramesK         =        1;  // the number of timeframes to unroll
    pPars->fConeBias        =        0;
    pPars->fRewrite         =        0;
    pPars->fLatchCorr       =        0;
}